

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_curve.cpp
# Opt level: O0

bool __thiscall ON_CurveArray::Read(ON_CurveArray *this,ON_BinaryArchive *file)

{
  bool bVar1;
  int iVar2;
  ON_Curve *pOVar3;
  byte local_51;
  int local_48;
  int local_44;
  int i;
  int count;
  ON_Object *p;
  bool rc;
  ON__INT64 OStack_30;
  int flag;
  ON__INT64 big_value;
  int local_20;
  ON__UINT32 tcode;
  int minor_version;
  int major_version;
  ON_BinaryArchive *file_local;
  ON_CurveArray *this_local;
  
  tcode = 0;
  local_20 = 0;
  big_value._4_4_ = 0;
  OStack_30 = 0;
  _minor_version = file;
  file_local = (ON_BinaryArchive *)this;
  Destroy(this);
  p._3_1_ = ON_BinaryArchive::BeginRead3dmBigChunk
                      (_minor_version,(uint *)((long)&big_value + 4),&stack0xffffffffffffffd0);
  if ((bool)p._3_1_) {
    p._3_1_ = big_value._4_4_ == 0x40008000;
    if ((bool)p._3_1_) {
      p._3_1_ = ON_BinaryArchive::Read3dmChunkVersion(_minor_version,(int *)&tcode,&local_20);
    }
    if (((bool)p._3_1_ == false) || (tcode != 1)) {
      p._3_1_ = 0;
    }
    else {
      p._3_1_ = ON_BinaryArchive::ReadInt(_minor_version,&local_44);
      if ((bool)p._3_1_) {
        ON_SimpleArray<ON_Curve_*>::SetCapacity
                  (&this->super_ON_SimpleArray<ON_Curve_*>,(long)local_44);
        ON_SimpleArray<ON_Curve_*>::SetCount(&this->super_ON_SimpleArray<ON_Curve_*>,local_44);
        ON_SimpleArray<ON_Curve_*>::Zero(&this->super_ON_SimpleArray<ON_Curve_*>);
        local_48 = 0;
        while( true ) {
          local_51 = 0;
          if (((p._3_1_ & 1) != 0) && (local_51 = 0, local_48 < local_44)) {
            local_51 = p._3_1_;
          }
          if ((local_51 & 1) == 0) break;
          p._4_4_ = 0;
          p._3_1_ = ON_BinaryArchive::ReadInt(_minor_version,(ON__INT32 *)((long)&p + 4));
          if (((bool)p._3_1_) && (p._4_4_ == 1)) {
            _i = (ON_Object *)0x0;
            iVar2 = ON_BinaryArchive::ReadObject(_minor_version,(ON_Object **)&i);
            p._3_1_ = -(iVar2 != 0) & 1;
            pOVar3 = ON_Curve::Cast(_i);
            (this->super_ON_SimpleArray<ON_Curve_*>).m_a[local_48] = pOVar3;
            if (((this->super_ON_SimpleArray<ON_Curve_*>).m_a[local_48] == (ON_Curve *)0x0) &&
               (_i != (ON_Object *)0x0)) {
              (*_i->_vptr_ON_Object[4])();
            }
          }
          local_48 = local_48 + 1;
        }
      }
    }
    bVar1 = ON_BinaryArchive::EndRead3dmChunk(_minor_version);
    if (!bVar1) {
      p._3_1_ = 0;
    }
  }
  return (bool)(p._3_1_ & 1);
}

Assistant:

bool ON_CurveArray::Read( ON_BinaryArchive& file )
{
  int major_version = 0;
  int minor_version = 0;
  ON__UINT32 tcode = 0;
  ON__INT64 big_value = 0;
  int flag;
  Destroy();
  bool rc = file.BeginRead3dmBigChunk( &tcode, &big_value );
  if (rc) 
  {
    rc = ( tcode == TCODE_ANONYMOUS_CHUNK );
    if (rc) rc = file.Read3dmChunkVersion(&major_version,&minor_version);
    if (rc && major_version == 1) 
    {
      ON_Object* p;
      int count;
      rc = file.ReadInt( &count );
      if (rc) 
      {
        SetCapacity(count);
        SetCount(count);
        Zero();
        int i;
        for ( i = 0; rc && i < count && rc; i++ ) 
        {
          flag = 0;
          rc = file.ReadInt(&flag);
          if (rc && flag==1) 
          {
            p = 0;
            rc = file.ReadObject( &p ) ? true : false; // polymorphic curves
            m_a[i] = ON_Curve::Cast(p);
            if ( !m_a[i] )
              delete p;
          }
        }
      }
    }
    else 
    {
      rc = false;
    }
    if ( !file.EndRead3dmChunk() )
    {
      rc = false;
    }
  }
  return rc;
}